

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

char * get_current_charset(archive *a)

{
  uint uVar1;
  char *pcVar2;
  long in_RDI;
  char *cur_charset;
  char *in_stack_ffffffffffffffe8;
  undefined8 local_10;
  
  if (in_RDI == 0) {
    local_10 = default_iconv_charset(in_stack_ffffffffffffffe8);
  }
  else {
    local_10 = default_iconv_charset(in_stack_ffffffffffffffe8);
    if (*(long *)(in_RDI + 0x58) == 0) {
      pcVar2 = strdup(local_10);
      *(char **)(in_RDI + 0x58) = pcVar2;
      uVar1 = get_current_codepage();
      *(uint *)(in_RDI + 0x60) = uVar1;
      uVar1 = get_current_oemcp();
      *(uint *)(in_RDI + 100) = uVar1;
    }
  }
  return local_10;
}

Assistant:

static const char *
get_current_charset(struct archive *a)
{
	const char *cur_charset;

	if (a == NULL)
		cur_charset = default_iconv_charset("");
	else {
		cur_charset = default_iconv_charset(a->current_code);
		if (a->current_code == NULL) {
			a->current_code = strdup(cur_charset);
			a->current_codepage = get_current_codepage();
			a->current_oemcp = get_current_oemcp();
		}
	}
	return (cur_charset);
}